

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUMagCal.cpp
# Opt level: O0

void __thiscall RTIMUMagCal::newMinMaxData(RTIMUMagCal *this,RTVector3 *data)

{
  RTFLOAT RVar1;
  RTFLOAT RVar2;
  int local_1c;
  int i;
  RTVector3 *data_local;
  RTIMUMagCal *this_local;
  
  if (this->m_startCount < 1) {
    for (local_1c = 0; local_1c < 3; local_1c = local_1c + 1) {
      RVar1 = RTVector3::data(&this->m_magMin,local_1c);
      RVar2 = RTVector3::data(data,local_1c);
      if (RVar2 < RVar1) {
        RVar1 = RTVector3::data(data,local_1c);
        RTVector3::setData(&this->m_magMin,local_1c,RVar1);
      }
      RVar1 = RTVector3::data(&this->m_magMax,local_1c);
      RVar2 = RTVector3::data(data,local_1c);
      if (RVar1 < RVar2) {
        RVar1 = RTVector3::data(data,local_1c);
        RTVector3::setData(&this->m_magMax,local_1c,RVar1);
      }
    }
  }
  else {
    this->m_startCount = this->m_startCount + -1;
  }
  return;
}

Assistant:

void RTIMUMagCal::newMinMaxData(const RTVector3& data)
{
    if (m_startCount > 0) {
        m_startCount--;
        return;
    }

    for (int i = 0; i < 3; i++) {
        if (m_magMin.data(i) > data.data(i)) {
            m_magMin.setData(i, data.data(i));
        }

        if (m_magMax.data(i) < data.data(i)) {
            m_magMax.setData(i, data.data(i));
        }
    }
}